

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_290fd::TestStreamingLongWritesCorrectCharacters::RunImpl
          (TestStreamingLongWritesCorrectCharacters *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  char *actual;
  TestDetails **ppTVar2;
  MemoryOutStream stream;
  TestDetails TStack_1c8;
  undefined1 local_1a8 [408];
  
  UnitTest::MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1a8);
  std::ostream::_M_insert<long>((long)local_1a8);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  actual = UnitTest::MemoryOutStream::GetText((MemoryOutStream *)local_1a8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_1c8,*ppTVar2,0x32);
  UnitTest::CheckEqual(results,"-123",actual,&TStack_1c8);
  UnitTest::MemoryOutStream::~MemoryOutStream
            ((MemoryOutStream *)local_1a8,&UnitTest::MemoryOutStream::VTT);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x90));
  return;
}

Assistant:

TEST(StreamingLongWritesCorrectCharacters)
{
    MemoryOutStream stream;
    stream << (long)(-123);
    CHECK_EQUAL("-123", stream.GetText());
}